

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::
RegisterTests(ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>
              *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *__s;
  pointer pcVar3;
  element_type *peVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_>_>
  _Var5;
  _Alloc_hider _Var6;
  char cVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  long *plVar12;
  int *piVar13;
  ostream *poVar14;
  size_t sVar15;
  const_iterator cVar16;
  long *plVar17;
  char *pcVar18;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  long lVar19;
  uint uVar20;
  size_t sVar21;
  pointer pIVar22;
  long lVar23;
  bool bVar24;
  string param_name;
  string test_suite_name;
  string test_name;
  ParamGenerator<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode> generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  pointer local_330;
  string local_320;
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  size_t local_2e0;
  ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>
  *local_2d8;
  int *local_2d0;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  string local_2a8;
  long *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  CodeLocation local_278;
  pointer local_250;
  pointer local_248;
  pointer local_240;
  ParamNameGeneratorFunc *local_238;
  long *local_230;
  long local_220 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  CodeLocation local_1e0;
  TestParamInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode> local_1b8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_300 = &local_2f0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = '\0';
  local_330 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_250 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_330 != local_250) {
    bVar8 = false;
    local_2d8 = this;
    do {
      pIVar22 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_248 = (this->instantiations_).
                  super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::InstantiationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar22 != local_248) {
        do {
          (*pIVar22->generator)(&local_288);
          sVar2 = (pIVar22->name)._M_string_length;
          local_238 = pIVar22->name_func;
          __s = pIVar22->file;
          iVar10 = pIVar22->line;
          if (sVar2 == 0) {
            local_2f8 = 0;
            *local_300 = 0;
          }
          else {
            local_1b8._0_8_ = local_1a8;
            pcVar3 = (pIVar22->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_1b8,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)&local_1b8);
            std::__cxx11::string::operator=((string *)&local_300,(string *)&local_1b8);
            if ((long *)local_1b8._0_8_ != local_1a8) {
              operator_delete((void *)local_1b8._0_8_,local_1a8[0] + 1);
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_300,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_210._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_210._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_210._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_210._M_impl.super__Rb_tree_header._M_header;
          local_210._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_210._M_impl.super__Rb_tree_header._M_header._M_right =
               local_210._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar11 = (long *)(**(code **)(*local_288 + 0x10))();
          plVar12 = (long *)(**(code **)(*local_288 + 0x18))();
          local_240 = pIVar22;
          if (plVar11 != plVar12) {
            sVar21 = 0;
            while( true ) {
              cVar7 = (**(code **)(*plVar11 + 0x30))(plVar11,plVar12);
              if (cVar7 != '\0') break;
              piVar13 = (int *)(**(code **)(*plVar11 + 0x28))();
              local_2c0 = 0;
              *local_2c8 = '\0';
              local_1b8.param = *piVar13;
              local_1b8.index = sVar21;
              (*local_238)(&local_320,&local_1b8);
              _Var6._M_p = local_320._M_dataplus._M_p;
              local_2d0 = piVar13;
              if (local_320._M_string_length == 0) {
                bVar8 = false;
              }
              else {
                lVar23 = local_320._M_string_length - 1;
                lVar19 = 0;
                do {
                  uVar20 = (uint)(byte)_Var6._M_p[lVar19];
                  iVar9 = isalnum(uVar20);
                  bVar8 = iVar9 != 0 || uVar20 == 0x5f;
                  if (iVar9 == 0 && uVar20 != 0x5f) break;
                  bVar24 = lVar23 != lVar19;
                  lVar19 = lVar19 + 1;
                } while (bVar24);
              }
              bVar8 = IsTrue(bVar8);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_320._M_dataplus._M_p,
                                     local_320._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," line ",6);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,iVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,anon_var_dwarf_a22956 + 5,0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              cVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_210,&local_320);
              bVar8 = IsTrue((_Rb_tree_header *)cVar16._M_node ==
                             &local_210._M_impl.super__Rb_tree_header);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_320._M_dataplus._M_p,
                                     local_320._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\', in ",6);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," line ",6);
                plVar17 = (long *)std::ostream::operator<<(poVar14,iVar10);
                std::ios::widen((char)*(undefined8 *)(*plVar17 + -0x18) + (char)plVar17);
                std::ostream::put((char)plVar17);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              peVar4 = (local_330->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar18 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_2c8,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar18);
              }
              std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_320._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_210,&local_320);
              local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_2a8,local_300,local_300 + local_2f8);
              pcVar18 = local_2c8;
              std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
              std::ostream::operator<<(local_1a8,*local_2d0);
              std::__cxx11::stringbuf::str();
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
              std::ios_base::~ios_base(local_138);
              plVar17 = local_230;
              peVar4 = (local_330->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_278.file._M_dataplus._M_p = (pointer)&local_278.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_278,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_278.line = (peVar4->code_location).line;
              iVar9 = (*(local_2d8->super_ParameterizedTestSuiteInfoBase).
                        _vptr_ParameterizedTestSuiteInfoBase[3])();
              bVar8 = IsTrue(true);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                           ,0x6a);
                if (__s == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19ac9f0);
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,__s,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,iVar10);
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              bVar8 = IsTrue(true);
              if (!bVar8) {
                GTestLog::GTestLog((GTestLog *)&local_1b8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/googletest-src/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                           ,0x6f);
                local_2e0 = sVar21;
                if (__s == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x19ac9f0);
                }
                else {
                  sVar15 = strlen(__s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,__s,sVar15);
                }
                sVar21 = local_2e0;
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,iVar10);
                GTestLog::~GTestLog((GTestLog *)&local_1b8);
              }
              _Var5.
              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_*,_false>
              ._M_head_impl =
                   (((local_330->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->test_meta_factory)._M_t.
                   super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_>_>
                   .
                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_*,_false>
              ;
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)_Var5.
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_*,_false>
                                              ._M_head_impl + 0x10))
                                  (_Var5.
                                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>_*,_false>
                                   ._M_head_impl,*local_2d0);
              MakeAndRegisterTestInfo
                        (&local_2a8,pcVar18,(char *)0x0,(char *)plVar17,&local_278,
                         (TypeId)CONCAT44(extraout_var,iVar9),(SetUpTestSuiteFunc)0x0,
                         (TearDownTestSuiteFunc)0x0,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278.file._M_dataplus._M_p != &local_278.file.field_2) {
                operator_delete(local_278.file._M_dataplus._M_p,
                                local_278.file.field_2._M_allocated_capacity + 1);
              }
              if (local_230 != local_220) {
                operator_delete(local_230,local_220[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p,
                                local_2a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              sVar21 = sVar21 + 1;
              bVar8 = true;
              (**(code **)(*plVar11 + 0x18))(plVar11);
            }
          }
          if (plVar12 != (long *)0x0) {
            (**(code **)(*plVar12 + 8))(plVar12);
          }
          pIVar22 = local_240;
          this = local_2d8;
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 8))();
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_210);
          if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
          }
          pIVar22 = pIVar22 + 1;
        } while (pIVar22 != local_248);
      }
      local_330 = local_330 + 1;
    } while (local_330 != local_250);
    if (bVar8) goto LAB_00a1da7f;
  }
  iVar10 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_1e0.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_1e0.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar10),&local_1e0,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p,local_1e0.file.field_2._M_allocated_capacity + 1
                   );
  }
LAB_00a1da7f:
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }